

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cpp
# Opt level: O3

Pattern * compile(Quantifier *q)

{
  vector<Pattern*,std::allocator<Pattern*>> *this;
  Pattern *pPVar1;
  Pattern *pPVar2;
  Pattern *pPVar3;
  iterator iVar4;
  Pattern *ch;
  Pattern *local_38;
  Pattern *local_30;
  
  pPVar1 = (Pattern *)operator_new(0x14);
  *(undefined4 *)pPVar1 = 0xb;
  pPVar2 = (Pattern *)operator_new(0x30);
  *(undefined4 *)pPVar2 = 4;
  this = (vector<Pattern*,std::allocator<Pattern*>> *)(pPVar2 + 8);
  *(undefined8 *)(pPVar2 + 8) = 0;
  *(undefined8 *)(pPVar2 + 0x10) = 0;
  *(undefined8 *)(pPVar2 + 0x18) = 0;
  pPVar3 = AST::dispatch<compile_template>((q->super_Unary).child);
  *(undefined8 *)(pPVar1 + 4) = *(undefined8 *)&q->minimum;
  pPVar1[0xc] = (Pattern)q->reluctant;
  *(undefined4 *)(pPVar1 + 0x10) = 3;
  local_30 = pPVar3;
  local_38 = (Pattern *)operator_new(4);
  *(undefined4 *)local_38 = 0xc;
  std::vector<Pattern*,std::allocator<Pattern*>>::_M_realloc_insert<Pattern*>
            (this,(iterator)0x0,&local_38);
  iVar4._M_current = *(Pattern ***)(pPVar2 + 0x10);
  local_38 = pPVar1;
  if (iVar4._M_current == *(Pattern ***)(pPVar2 + 0x18)) {
    std::vector<Pattern*,std::allocator<Pattern*>>::_M_realloc_insert<Pattern*>
              (this,iVar4,&local_38);
    iVar4._M_current = *(Pattern ***)(pPVar2 + 0x10);
  }
  else {
    *iVar4._M_current = pPVar1;
    iVar4._M_current = (Pattern **)(*(long *)(pPVar2 + 0x10) + 8);
    *(Pattern ***)(pPVar2 + 0x10) = iVar4._M_current;
  }
  if (iVar4._M_current == *(Pattern ***)(pPVar2 + 0x18)) {
    std::vector<Pattern*,std::allocator<Pattern*>>::_M_realloc_insert<Pattern*const&>
              (this,iVar4,&local_30);
  }
  else {
    *iVar4._M_current = pPVar3;
    *(long *)(pPVar2 + 0x10) = *(long *)(pPVar2 + 0x10) + 8;
  }
  local_38 = (Pattern *)operator_new(8);
  *(undefined8 *)local_38 = 0xfffffffe0000000a;
  iVar4._M_current = *(Pattern ***)(pPVar2 + 0x10);
  if (iVar4._M_current == *(Pattern ***)(pPVar2 + 0x18)) {
    std::vector<Pattern*,std::allocator<Pattern*>>::_M_realloc_insert<Pattern*>
              (this,iVar4,&local_38);
  }
  else {
    *iVar4._M_current = local_38;
    *(long *)(pPVar2 + 0x10) = *(long *)(pPVar2 + 0x10) + 8;
  }
  if (*(int *)local_30 == 4) {
    *(Pattern **)(local_30 + 0x20) = pPVar2;
    *(int *)(local_30 + 0x28) = 2;
  }
  return pPVar2;
}

Assistant:

static Pattern* compile(AST::Quantifier* q) {
    auto* pq = new P_Quantifier;
    auto* qseq = new P_Sequence;
    Pattern* ch = compile(q->child);

    pq->minimum = q->minimum;
    pq->maximum = q->maximum;
    pq->reluctant = q->reluctant;
    pq->offset = 3;

    qseq->v.push_back(rcps(new P_QReset));
    qseq->v.push_back(rcps(pq));
    qseq->v.push_back(ch);
    qseq->v.push_back(rcps(new P_Jump{ -2 }));

    P_Sequence* tseq = PT_dynamic_cast<P_Sequence*>(ch);
    if (tseq) {
        tseq->parent = qseq;
        tseq->iparent = 2;
    }
    return rcps(qseq);
}